

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

PsbtSignatureDataStruct * __thiscall
cfd::js::api::json::PsbtSignatureData::ConvertToStruct
          (PsbtSignatureDataStruct *__return_storage_ptr__,PsbtSignatureData *this)

{
  PsbtSignatureData *this_local;
  PsbtSignatureDataStruct *result;
  
  PsbtSignatureDataStruct::PsbtSignatureDataStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->pubkey_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->signature,(string *)&this->signature_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

PsbtSignatureDataStruct PsbtSignatureData::ConvertToStruct() const {  // NOLINT
  PsbtSignatureDataStruct result;
  result.pubkey = pubkey_;
  result.signature = signature_;
  result.ignore_items = ignore_items;
  return result;
}